

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O2

void opengv::relative_pose::modules::fivept_nister::pollishCoefficients
               (Matrix<double,_10,_20,_0,_10,_20> *A,double *x_coeff,double *y_coeff,double *z_coeff
               )

{
  VectorXd x;
  int n;
  Matrix<double,__1,_1,_0,__1,_1> local_1d0;
  int local_1bc;
  NumericalDiff<opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor,_(Eigen::NumericalDiffMode)0>
  local_1b8;
  undefined1 local_1a0 [48];
  undefined1 auStack_170 [24];
  undefined1 local_158 [40];
  undefined1 auStack_130 [24];
  Index local_118;
  undefined1 uStack_110;
  undefined7 uStack_10f;
  undefined1 uStack_108;
  undefined7 uStack_107;
  undefined1 uStack_100;
  undefined7 uStack_ff;
  undefined1 uStack_f8;
  undefined8 uStack_f7;
  NumericalDiff<opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor,_(Eigen::NumericalDiffMode)0>
  *local_e8;
  undefined1 local_d0 [64];
  
  local_1bc = 3;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_1d0,&local_1bc);
  local_e8 = &local_1b8;
  *local_1d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       *x_coeff;
  local_1d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[1] =
       *y_coeff;
  local_1d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[2] =
       *z_coeff;
  local_d0 = ZEXT864(0) << 0x20;
  auStack_130 = (undefined1  [24])0x0;
  auStack_170 = local_d0._0_24_;
  local_158 = (undefined1  [40])0x0;
  local_118 = 0;
  uStack_110 = 0;
  uStack_10f = 0;
  uStack_108 = 0;
  uStack_107 = 0;
  uStack_100 = 0;
  uStack_ff = 0;
  uStack_f8 = 0;
  uStack_f7 = 0;
  local_1b8.super_PollishCoefficientsFunctor.super_OptimizationFunctor<double,__1,__1>.m_inputs = 3;
  local_1b8.super_PollishCoefficientsFunctor.super_OptimizationFunctor<double,__1,__1>.m_values = 10
  ;
  local_1b8.epsfcn = 0.0;
  local_1a0._44_4_ = 0;
  local_1a0._32_12_ = ZEXT812(0);
  local_1a0._32_16_ = local_1a0._32_16_ << 0x20;
  local_1a0._0_8_ = 100.0;
  local_1a0._16_8_ = 2.220446049250313e-06;
  local_1a0._24_8_ = 2.220446049250313e-06;
  local_1a0._8_8_ = 5;
  local_1b8.super_PollishCoefficientsFunctor._A = A;
  Eigen::
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor,_(Eigen::NumericalDiffMode)0>,_double>
  ::minimize((LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor,_(Eigen::NumericalDiffMode)0>,_double>
              *)local_1a0,&local_1d0);
  *x_coeff = *local_1d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data;
  *y_coeff = local_1d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data[1];
  *z_coeff = local_1d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data[2];
  Eigen::
  LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor,_(Eigen::NumericalDiffMode)0>,_double>
  ::~LevenbergMarquardt
            ((LevenbergMarquardt<Eigen::NumericalDiff<opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor,_(Eigen::NumericalDiffMode)0>,_double>
              *)local_1a0);
  Eigen::internal::handmade_aligned_free
            (local_1d0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
  return;
}

Assistant:

void
opengv::relative_pose::modules::fivept_nister::pollishCoefficients(
    const Eigen::Matrix<double,10,20> & A,
    double & x_coeff,
    double & y_coeff,
    double & z_coeff)
{
  const int n=3;
  VectorXd x(n);

  x[0] = x_coeff;
  x[1] = y_coeff;
  x[2] = z_coeff;

  PollishCoefficientsFunctor functor( A );
  NumericalDiff<PollishCoefficientsFunctor> numDiff(functor);
  LevenbergMarquardt< NumericalDiff<PollishCoefficientsFunctor> >
      lm(numDiff);

  lm.resetParameters();
  lm.parameters.ftol = 1.E10*NumTraits<double>::epsilon();
  lm.parameters.xtol = 1.E10*NumTraits<double>::epsilon();
  lm.parameters.maxfev = 5;
  lm.minimize(x);

  x_coeff = x[0];
  y_coeff = x[1];
  z_coeff = x[2];
}